

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O1

void arith_encode(j_compress_ptr cinfo,uchar *st,int val)

{
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr **pp_Var1;
  jpeg_entropy_encoder *pjVar2;
  _func_void_j_compress_ptr **pp_Var3;
  byte bVar4;
  int iVar5;
  jpeg_entropy_encoder *pjVar6;
  _func_void_j_compress_ptr_boolean *p_Var7;
  ulong uVar8;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var9;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var10;
  long lVar11;
  
  pjVar6 = cinfo->entropy;
  bVar4 = *st;
  uVar8 = jpeg_aritab[bVar4 & 0x7f];
  p_Var9 = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)((long)uVar8 >> 0x10);
  p_Var10 = pjVar6[1].encode_mcu + -(long)p_Var9;
  pjVar6[1].encode_mcu = p_Var10;
  if ((uint)(bVar4 >> 7) == val) {
    if (0x7fff < (long)p_Var10) {
      return;
    }
    uVar8 = uVar8 >> 8 & 0xffffff;
    if ((long)p_Var9 <= (long)p_Var10) goto LAB_0010ef32;
  }
  else if ((long)p_Var10 < (long)p_Var9) goto LAB_0010ef32;
  pjVar6[1].start_pass = (_func_void_j_compress_ptr_boolean *)(p_Var10 + (long)pjVar6[1].start_pass)
  ;
  pjVar6[1].encode_mcu = p_Var9;
LAB_0010ef32:
  *st = bVar4 & 0x80 ^ (byte)uVar8;
  do {
    pjVar6[1].encode_mcu =
         (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)((long)pjVar6[1].encode_mcu << 1);
    p_Var7 = (_func_void_j_compress_ptr_boolean *)((long)pjVar6[1].start_pass * 2);
    pjVar6[1].start_pass = p_Var7;
    pp_Var1 = &pjVar6[2].encode_mcu;
    *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
    if (*(int *)pp_Var1 == 0) {
      lVar11 = (long)p_Var7 >> 0x13;
      if (lVar11 < 0x100) {
        if (lVar11 != 0xff) {
          iVar5 = *(int *)((long)&pjVar6[2].encode_mcu + 4);
          if (iVar5 == 0) {
            pjVar6[2].start_pass = pjVar6[2].start_pass + 1;
          }
          else if (-1 < iVar5) {
            p_Var7 = pjVar6[2].start_pass;
            while (p_Var7 != (_func_void_j_compress_ptr_boolean *)0x0) {
              emit_byte(0,cinfo);
              pjVar2 = pjVar6 + 2;
              pjVar2->start_pass = pjVar2->start_pass + -1;
              p_Var7 = pjVar2->start_pass;
            }
            emit_byte(*(int *)((long)&pjVar6[2].encode_mcu + 4),cinfo);
          }
          if (pjVar6[1].finish_pass != (_func_void_j_compress_ptr *)0x0) {
            p_Var7 = pjVar6[2].start_pass;
            while (p_Var7 != (_func_void_j_compress_ptr_boolean *)0x0) {
              emit_byte(0,cinfo);
              pjVar2 = pjVar6 + 2;
              pjVar2->start_pass = pjVar2->start_pass + -1;
              p_Var7 = pjVar2->start_pass;
            }
            do {
              emit_byte(0xff,cinfo);
              emit_byte(0,cinfo);
              pp_Var3 = &pjVar6[1].finish_pass;
              *pp_Var3 = *pp_Var3 + -1;
            } while (*pp_Var3 != (_func_void_j_compress_ptr *)0x0);
          }
          goto LAB_0010f02d;
        }
        pjVar6[1].finish_pass = pjVar6[1].finish_pass + 1;
      }
      else {
        if (-1 < *(int *)((long)&pjVar6[2].encode_mcu + 4)) {
          p_Var7 = pjVar6[2].start_pass;
          while (p_Var7 != (_func_void_j_compress_ptr_boolean *)0x0) {
            emit_byte(0,cinfo);
            pjVar2 = pjVar6 + 2;
            pjVar2->start_pass = pjVar2->start_pass + -1;
            p_Var7 = pjVar2->start_pass;
          }
          emit_byte(*(int *)((long)&pjVar6[2].encode_mcu + 4) + 1,cinfo);
          if (*(int *)((long)&pjVar6[2].encode_mcu + 4) == 0xfe) {
            emit_byte(0,cinfo);
          }
        }
        pjVar6[2].start_pass =
             (_func_void_j_compress_ptr_boolean *)
             (pjVar6[1].finish_pass + (long)pjVar6[2].start_pass);
        pjVar6[1].finish_pass = (_func_void_j_compress_ptr *)0x0;
LAB_0010f02d:
        *(uint *)((long)&pjVar6[2].encode_mcu + 4) = (uint)lVar11 & 0xff;
      }
      pjVar6[1].start_pass =
           (_func_void_j_compress_ptr_boolean *)((ulong)pjVar6[1].start_pass & 0x7ffff);
      *(int *)&pjVar6[2].encode_mcu = *(int *)&pjVar6[2].encode_mcu + 8;
    }
    if (0x7fff < (long)pjVar6[1].encode_mcu) {
      return;
    }
  } while( true );
}

Assistant:

LOCAL(void)
arith_encode (j_compress_ptr cinfo, unsigned char *st, int val) 
{
  register arith_entropy_ptr e = (arith_entropy_ptr) cinfo->entropy;
  register unsigned char nl, nm;
  register INT32 qe, temp;
  register int sv;

  /* Fetch values from our compact representation of Table D.3(D.2):
   * Qe values and probability estimation state machine
   */
  sv = *st;
  qe = jpeg_aritab[sv & 0x7F];	/* => Qe_Value */
  nl = qe & 0xFF; qe >>= 8;	/* Next_Index_LPS + Switch_MPS */
  nm = qe & 0xFF; qe >>= 8;	/* Next_Index_MPS */

  /* Encode & estimation procedures per sections D.1.4 & D.1.5 */
  e->a -= qe;
  if (val != (sv >> 7)) {
    /* Encode the less probable symbol */
    if (e->a >= qe) {
      /* If the interval size (qe) for the less probable symbol (LPS)
       * is larger than the interval size for the MPS, then exchange
       * the two symbols for coding efficiency, otherwise code the LPS
       * as usual: */
      e->c += e->a;
      e->a = qe;
    }
    *st = (sv & 0x80) ^ nl;	/* Estimate_after_LPS */
  } else {
    /* Encode the more probable symbol */
    if (e->a >= 0x8000L)
      return;  /* A >= 0x8000 -> ready, no renormalization required */
    if (e->a < qe) {
      /* If the interval size (qe) for the less probable symbol (LPS)
       * is larger than the interval size for the MPS, then exchange
       * the two symbols for coding efficiency: */
      e->c += e->a;
      e->a = qe;
    }
    *st = (sv & 0x80) ^ nm;	/* Estimate_after_MPS */
  }

  /* Renormalization & data output per section D.1.6 */
  do {
    e->a <<= 1;
    e->c <<= 1;
    if (--e->ct == 0) {
      /* Another byte is ready for output */
      temp = e->c >> 19;
      if (temp > 0xFF) {
	/* Handle overflow over all stacked 0xFF bytes */
	if (e->buffer >= 0) {
	  if (e->zc)
	    do emit_byte(0x00, cinfo);
	    while (--e->zc);
	  emit_byte(e->buffer + 1, cinfo);
	  if (e->buffer + 1 == 0xFF)
	    emit_byte(0x00, cinfo);
	}
	e->zc += e->sc;  /* carry-over converts stacked 0xFF bytes to 0x00 */
	e->sc = 0;
	/* Note: The 3 spacer bits in the C register guarantee
	 * that the new buffer byte can't be 0xFF here
	 * (see page 160 in the P&M JPEG book). */
	e->buffer = temp & 0xFF;  /* new output byte, might overflow later */
      } else if (temp == 0xFF) {
	++e->sc;  /* stack 0xFF byte (which might overflow later) */
      } else {
	/* Output all stacked 0xFF bytes, they will not overflow any more */
	if (e->buffer == 0)
	  ++e->zc;
	else if (e->buffer >= 0) {
	  if (e->zc)
	    do emit_byte(0x00, cinfo);
	    while (--e->zc);
	  emit_byte(e->buffer, cinfo);
	}
	if (e->sc) {
	  if (e->zc)
	    do emit_byte(0x00, cinfo);
	    while (--e->zc);
	  do {
	    emit_byte(0xFF, cinfo);
	    emit_byte(0x00, cinfo);
	  } while (--e->sc);
	}
	e->buffer = temp & 0xFF;  /* new output byte (can still overflow) */
      }
      e->c &= 0x7FFFFL;
      e->ct += 8;
    }
  } while (e->a < 0x8000L);
}